

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::FiberPool::Impl::disposeImpl(Impl *this,void *pointer)

{
  anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:663:5)>_2
  aVar1;
  bool bVar2;
  deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> *pdVar3;
  size_type sVar4;
  anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:663:5)>_2
  *paVar5;
  undefined1 local_a8 [8];
  Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> lock;
  FiberStack **stackPtr;
  FiberStack **__end5;
  FiberStack **__begin5;
  FiberStack *(*__range5) [2];
  CoreLocalFreelist *core;
  CoreLocalFreelist *local_50;
  CoreLocalFreelist *_core669;
  Maybe<kj::_::Mutex::Waiter_&> local_38;
  undefined1 local_30 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:663:5)>
  _kjDefer663;
  FiberStack *stack;
  void *pointer_local;
  Impl *this_local;
  
  local_38.ptr = (Waiter *)&_kjDefer663.maybeFunc.ptr.field_1;
  _kjDefer663.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:663:5)>_2
        )pointer;
  defer<kj::FiberPool::Impl::disposeImpl(void*)const::_lambda()_1_>
            ((kj *)local_30,(Type *)&local_38);
  bVar2 = kj::_::FiberStack::isReset((FiberStack *)_kjDefer663.maybeFunc.ptr.field_1);
  if (bVar2) {
    lookupCoreLocalFreelist((Impl *)&core);
    local_50 = kj::_::readMaybe<kj::FiberPool::Impl::CoreLocalFreelist>
                         ((Maybe<kj::FiberPool::Impl::CoreLocalFreelist_&> *)&core);
    if (local_50 != (CoreLocalFreelist *)0x0) {
      for (__end5 = (FiberStack **)local_50;
          __end5 != (FiberStack **)((long)&local_50->field_0 + 0x10); __end5 = __end5 + 1) {
        LOCK();
        aVar1 = (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:663:5)>_2
                 )*__end5;
        *__end5 = (FiberStack *)_kjDefer663.maybeFunc.ptr.field_1;
        UNLOCK();
        if (aVar1 == (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:663:5)>_2
                      )0x0) {
          lock.ptr._4_4_ = 1;
          _kjDefer663.maybeFunc.ptr.field_1 =
               (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:663:5)>_2
                )0x0;
          goto LAB_003d9c26;
        }
        _kjDefer663.maybeFunc.ptr.field_1 = aVar1;
      }
    }
    MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::
    lockExclusive((MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>
                   *)local_a8,&this->freelist);
    pdVar3 = Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::
             operator->((Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>
                         *)local_a8);
    std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::push_back
              (pdVar3,(value_type *)&_kjDefer663.maybeFunc.ptr.field_1);
    pdVar3 = Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::
             operator->((Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>
                         *)local_a8);
    sVar4 = std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::size(pdVar3);
    if (this->maxFreelist < sVar4) {
      pdVar3 = Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::
               operator->((Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>
                           *)local_a8);
      paVar5 = (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:663:5)>_2
                *)std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::front
                            (pdVar3);
      _kjDefer663.maybeFunc.ptr.field_1 = *paVar5;
      pdVar3 = Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::
               operator->((Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>
                           *)local_a8);
      std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::pop_front(pdVar3);
    }
    else {
      _kjDefer663.maybeFunc.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:663:5)>_2
            )0x0;
    }
    Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::~Locked
              ((Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> *)
               local_a8);
  }
  lock.ptr._4_4_ = 0;
LAB_003d9c26:
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:663:5)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:663:5)>
               *)local_30);
  return;
}

Assistant:

void disposeImpl(void* pointer) const override {
    _::FiberStack* stack = reinterpret_cast<_::FiberStack*>(pointer);
    KJ_DEFER(delete stack);

    // Verify that the stack was reset before returning, otherwise it might be in a weird state
    // where we don't want to reuse it.
    if (stack->isReset()) {
#if USE_CORE_LOCAL_FREELISTS
      KJ_IF_SOME(core, lookupCoreLocalFreelist()) {
        for (auto& stackPtr: core.stacks) {
          stack = __atomic_exchange_n(&stackPtr, stack, __ATOMIC_RELEASE);
          if (stack == nullptr) {
            // Cool, we inserted the stack into an unused slot. We're done.
            return;
          }
        }
        // All slots were occupied, so we inserted the new stack in the front, pushed the rest back,
        // and now `stack` refers to the stack that fell off the end of the core-local list. That
        // needs to go into the global freelist.
      }
#endif

      auto lock = freelist.lockExclusive();
      lock->push_back(stack);
      if (lock->size() > maxFreelist) {
        stack = lock->front();
        lock->pop_front();
      } else {
        stack = nullptr;
      }
    }
  }